

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O3

deUint32 deMemoryHash(void *ptr,size_t numBytes)

{
  deUint32 dVar1;
  size_t sVar2;
  deUint8 *input;
  
  dVar1 = 0x1505;
  if (numBytes != 0) {
    sVar2 = 0;
    do {
      dVar1 = (uint)*(byte *)((long)ptr + sVar2) + dVar1 * 0x21;
      sVar2 = sVar2 + 1;
    } while (numBytes != sVar2);
  }
  return dVar1;
}

Assistant:

deUint32 deMemoryHash (const void* ptr, size_t numBytes)
{
	/* \todo [2010-05-10 pyry] Better generic hash function? */
	const deUint8*	input	= (const deUint8*)ptr;
	deUint32		hash	= 5381;

	DE_ASSERT(ptr);
	while (numBytes--)
		hash = (hash << 5) + hash + *input++;

	return hash;
}